

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::java::FileGenerator::Validate(FileGenerator *this,string *error)

{
  string *psVar1;
  bool bVar2;
  Edition EVar3;
  Descriptor *pDVar4;
  EnumDescriptor *pEVar5;
  FieldDescriptor *descriptor;
  ServiceDescriptor *pSVar6;
  LogMessage *pLVar7;
  int i;
  int iVar8;
  uint uVar9;
  EnumDescriptor *pEVar10;
  AlphaNum *in_R9;
  int i_4;
  int iVar11;
  FileDescriptor *pFVar12;
  string_view v;
  string_view classname;
  string_view classname_00;
  string *error_local;
  AlphaNum local_110;
  string local_e0;
  AlphaNum local_c0;
  AlphaNum local_90;
  AlphaNum local_60;
  
  local_110.piece_._M_str = (char *)local_110.piece_._M_len;
  classname._M_str = (this->classname_)._M_dataplus._M_p;
  classname._M_len = (this->classname_)._M_string_length;
  error_local = error;
  bVar2 = ClassNameResolver::HasConflictingClassName
                    (this->name_resolver_,this->file_,classname,EXACT_EQUAL);
  if (bVar2) {
    psVar1 = this->file_->name_;
    local_110.piece_._M_str = (psVar1->_M_dataplus)._M_p;
    local_110.piece_._M_len = psVar1->_M_string_length;
    local_60.piece_ =
         absl::lts_20250127::NullSafeStringView
                   (": Cannot generate Java output because the file\'s outer class name, \"");
    local_90.piece_._M_str = (this->classname_)._M_dataplus._M_p;
    local_90.piece_._M_len = (this->classname_)._M_string_length;
    local_c0.piece_ =
         absl::lts_20250127::NullSafeStringView
                   (
                   "\", matches the name of one of the types declared inside it.  Please either rename the type or use the java_outer_classname option to specify a different outer class name for the .proto file."
                   );
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_e0,(lts_20250127 *)&local_110,&local_60,&local_90,&local_c0,in_R9);
    std::__cxx11::string::operator=((string *)error_local,(string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    bVar2 = false;
  }
  else {
    classname_00._M_str = (this->classname_)._M_dataplus._M_p;
    classname_00._M_len = (this->classname_)._M_string_length;
    bVar2 = ClassNameResolver::HasConflictingClassName
                      (this->name_resolver_,this->file_,classname_00,EQUAL_IGNORE_CASE);
    if (bVar2) {
      absl::lts_20250127::log_internal::LogMessage::LogMessage
                ((LogMessage *)&local_110,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/file.cc"
                 ,0xe2);
      psVar1 = this->file_->name_;
      v._M_str = (psVar1->_M_dataplus)._M_p;
      v._M_len = psVar1->_M_string_length;
      pLVar7 = absl::lts_20250127::log_internal::LogMessage::operator<<((LogMessage *)&local_110,v);
      pLVar7 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar7,(char (*) [33])": The file\'s outer class name, \"");
      pLVar7 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar7,&this->classname_);
      pLVar7 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar7,(char (*) [65])
                                 "\", matches the name of one of the types declared inside it when "
                         );
      pLVar7 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar7,(char (*) [65])
                                 "case is ignored. This can cause compilation issues on Windows / ")
      ;
      pLVar7 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar7,(char (*) [49])"MacOS. Please either rename the type or use the ");
      pLVar7 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar7,(char (*) [64])
                                 "java_outer_classname option to specify a different outer class ");
      absl::lts_20250127::log_internal::LogMessage::operator<<
                (pLVar7,(char (*) [37])"name for the .proto file to be safe.");
      absl::lts_20250127::log_internal::LogMessage::~LogMessage((LogMessage *)&local_110);
    }
    pFVar12 = this->file_;
    local_110.piece_._M_len = (size_t)&error_local;
    for (iVar8 = 0; iVar8 < pFVar12->message_type_count_; iVar8 = iVar8 + 1) {
      pDVar4 = FileDescriptor::message_type(pFVar12,iVar8);
      protobuf::internal::
      VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/file.cc:238:56)>_>
      ::Visit<>((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_java_file_cc:238:56)>_>
                 *)&local_110,pDVar4);
    }
    for (uVar9 = 0; (int)uVar9 < pFVar12->enum_type_count_; uVar9 = uVar9 + 1) {
      pEVar10 = (EnumDescriptor *)(ulong)uVar9;
      pEVar5 = FileDescriptor::enum_type(pFVar12,uVar9);
      protobuf::internal::
      VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/file.cc:238:56)>_>
      ::Visit<>((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_java_file_cc:238:56)>_>
                 *)pEVar5,pEVar10);
    }
    for (iVar8 = 0; iVar8 < pFVar12->extension_count_; iVar8 = iVar8 + 1) {
      descriptor = FileDescriptor::extension(pFVar12,iVar8);
      protobuf::internal::
      VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/file.cc:238:56)>_>
      ::Visit<>((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_java_file_cc:238:56)>_>
                 *)&local_110,descriptor);
    }
    for (iVar8 = 0; iVar8 < pFVar12->service_count_; iVar8 = iVar8 + 1) {
      pSVar6 = FileDescriptor::service(pFVar12,iVar8);
      for (iVar11 = 0; iVar11 < pSVar6->method_count_; iVar11 = iVar11 + 1) {
        ServiceDescriptor::method(pSVar6,iVar11);
      }
    }
    pFVar12 = this->file_;
    if (((pFVar12->options_->field_0)._impl_.optimize_for_ == 3) &&
       ((this->options_).enforce_lite == false)) {
      absl::lts_20250127::log_internal::LogMessage::LogMessage
                ((LogMessage *)&local_110,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/file.cc"
                 ,0xf9);
      pLVar7 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         ((LogMessage *)&local_110,
                          (char (*) [66])
                          "The optimize_for = LITE_RUNTIME option is no longer supported by ");
      pLVar7 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar7,(char (*) [65])
                                 "protobuf Java code generator and is ignored--protoc will always ")
      ;
      pLVar7 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar7,(char (*) [64])
                                 "generate full runtime code for Java. To use Java Lite runtime, ");
      pLVar7 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar7,(char (*) [53])
                                 "users should use the Java Lite plugin instead. See:\n");
      absl::lts_20250127::log_internal::LogMessage::operator<<
                (pLVar7,(char (*) [69])
                        "  https://github.com/protocolbuffers/protobuf/blob/main/java/lite.md");
      absl::lts_20250127::log_internal::LogMessage::~LogMessage((LogMessage *)&local_110);
      pFVar12 = this->file_;
    }
    local_110.piece_._M_len = (size_t)&error_local;
    for (iVar8 = 0; iVar8 < pFVar12->message_type_count_; iVar8 = iVar8 + 1) {
      pDVar4 = FileDescriptor::message_type(pFVar12,iVar8);
      protobuf::internal::
      VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/file.cc:258:56)>_>
      ::Visit<>((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_java_file_cc:258:56)>_>
                 *)&local_110,pDVar4);
    }
    for (iVar8 = 0; iVar8 < pFVar12->enum_type_count_; iVar8 = iVar8 + 1) {
      pEVar5 = FileDescriptor::enum_type(pFVar12,iVar8);
      protobuf::internal::
      VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/file.cc:258:56)>_>
      ::Visit<>((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_java_file_cc:258:56)>_>
                 *)&local_110,pEVar5);
    }
    for (iVar8 = 0; iVar8 < pFVar12->extension_count_; iVar8 = iVar8 + 1) {
      FileDescriptor::extension(pFVar12,iVar8);
    }
    for (iVar8 = 0; iVar8 < pFVar12->service_count_; iVar8 = iVar8 + 1) {
      pSVar6 = FileDescriptor::service(pFVar12,iVar8);
      for (iVar11 = 0; iVar11 < pSVar6->method_count_; iVar11 = iVar11 + 1) {
        ServiceDescriptor::method(pSVar6,iVar11);
      }
    }
    pFVar12 = this->file_;
    local_110.piece_._M_len = (size_t)&error_local;
    for (iVar8 = 0; iVar8 < pFVar12->message_type_count_; iVar8 = iVar8 + 1) {
      pDVar4 = FileDescriptor::message_type(pFVar12,iVar8);
      protobuf::internal::
      VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/file.cc:272:56)>_>
      ::Visit<>((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_java_file_cc:272:56)>_>
                 *)&local_110,pDVar4);
    }
    for (uVar9 = 0; (int)uVar9 < pFVar12->enum_type_count_; uVar9 = uVar9 + 1) {
      pEVar10 = (EnumDescriptor *)(ulong)uVar9;
      pEVar5 = FileDescriptor::enum_type(pFVar12,uVar9);
      protobuf::internal::
      VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/file.cc:272:56)>_>
      ::Visit<>((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_java_file_cc:272:56)>_>
                 *)pEVar5,pEVar10);
    }
    for (iVar8 = 0; iVar8 < pFVar12->extension_count_; iVar8 = iVar8 + 1) {
      FileDescriptor::extension(pFVar12,iVar8);
    }
    for (iVar8 = 0; iVar8 < pFVar12->service_count_; iVar8 = iVar8 + 1) {
      pSVar6 = FileDescriptor::service(pFVar12,iVar8);
      for (iVar11 = 0; iVar11 < pSVar6->method_count_; iVar11 = iVar11 + 1) {
        ServiceDescriptor::method(pSVar6,iVar11);
      }
    }
    EVar3 = FileDescriptor::edition(this->file_);
    psVar1 = error_local;
    if ((1000 < (int)EVar3) && ((*(byte *)((long)&this->file_->options_->field_0 + 0x19) & 8) != 0))
    {
      local_110.piece_ =
           absl::lts_20250127::NullSafeStringView
                     (
                     "The file option `java_multiple_files` is not supported in editions 2024 and above, which defaults to the feature value of `nest_in_file_class = NO` (equivalent to `java_multiple_files = true`)."
                     );
      absl::lts_20250127::StrAppend(psVar1,&local_110);
    }
    bVar2 = error_local->_M_string_length == 0;
  }
  return bVar2;
}

Assistant:

bool FileGenerator::Validate(std::string* error) {
  // Check that no class name matches the file's class name.  This is a common
  // problem that leads to Java compile errors that can be hard to understand.
  // It's especially bad when using the java_multiple_files, since we would
  // end up overwriting the outer class with one of the inner ones.
  if (name_resolver_->HasConflictingClassName(file_, classname_,
                                              NameEquality::EXACT_EQUAL)) {
    *error = absl::StrCat(
        file_->name(),
        ": Cannot generate Java output because the file's outer class name, "
        "\"",
        classname_,
        "\", matches the name of one of the types declared inside it.  "
        "Please either rename the type or use the java_outer_classname "
        "option to specify a different outer class name for the .proto file.");
    return false;
  }
  // Similar to the check above, but ignore the case this time. This is not a
  // problem on Linux, but will lead to Java compile errors on Windows / Mac
  // because filenames are case-insensitive on those platforms.
  if (name_resolver_->HasConflictingClassName(
          file_, classname_, NameEquality::EQUAL_IGNORE_CASE)) {
    ABSL_LOG(WARNING)
        << file_->name() << ": The file's outer class name, \"" << classname_
        << "\", matches the name of one of the types declared inside it when "
        << "case is ignored. This can cause compilation issues on Windows / "
        << "MacOS. Please either rename the type or use the "
        << "java_outer_classname option to specify a different outer class "
        << "name for the .proto file to be safe.";
  }

  // Check that no field is a closed enum with implicit presence. For normal
  // cases this will be rejected by protoc before the generator is invoked, but
  // for cases like legacy_closed_enum it may reach the generator.
  google::protobuf::internal::VisitDescriptors(*file_, [&](const FieldDescriptor& field) {
    if (field.enum_type() != nullptr && !SupportUnknownEnumValue(&field) &&
        !field.has_presence() && !field.is_repeated()) {
      absl::StrAppend(error, "Field ", field.full_name(),
                      " has a closed enum type with implicit presence.\n");
    }
  });

  // Print a warning if optimize_for = LITE_RUNTIME is used.
  if (file_->options().optimize_for() == FileOptions::LITE_RUNTIME &&
      !options_.enforce_lite) {
    ABSL_LOG(WARNING)
        << "The optimize_for = LITE_RUNTIME option is no longer supported by "
        << "protobuf Java code generator and is ignored--protoc will always "
        << "generate full runtime code for Java. To use Java Lite runtime, "
        << "users should use the Java Lite plugin instead. See:\n"
        << "  "
           "https://github.com/protocolbuffers/protobuf/blob/main/java/"
           "lite.md";
  }
  google::protobuf::internal::VisitDescriptors(*file_, [&](const EnumDescriptor& enm) {
    if (CheckLargeEnum(&enm) && enm.is_closed()) {
      absl::StrAppend(
          error, enm.full_name(),
          " is a closed enum and can not be used with the large_enum feature.  "
          "Please migrate to an open enum first, which is a better fit for "
          "extremely large enums.\n");
    }
    absl::Status status = ValidateNestInFileClassFeature(enm);
    if (!status.ok()) {
      absl::StrAppend(error, status.message());
    }
  });

  google::protobuf::internal::VisitDescriptors(*file_, [&](const Descriptor& message) {
    absl::Status status = ValidateNestInFileClassFeature(message);
    if (!status.ok()) {
      absl::StrAppend(error, status.message());
    }
  });

  if (JavaGenerator::GetEdition(*file_) >= Edition::EDITION_2024) {
    if (file_->options().has_java_multiple_files()) {
      absl::StrAppend(
          error,
          "The file option `java_multiple_files` is not supported in "
          "editions 2024 and above, which defaults to the feature value of"
          " `nest_in_file_class = NO` (equivalent to "
          "`java_multiple_files = true`).");
    }
  }

  return error->empty();
}